

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BindDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::BindTargetListSyntax*,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,NameSyntax *args_2,BindTargetListSyntax **args_3,MemberSyntax *args_4)

{
  Token bind;
  BindDirectiveSyntax *this_00;
  
  this_00 = (BindDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BindDirectiveSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (BindDirectiveSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  bind.kind = args_1->kind;
  bind._2_1_ = args_1->field_0x2;
  bind.numFlags.raw = (args_1->numFlags).raw;
  bind.rawLen = args_1->rawLen;
  bind.info = args_1->info;
  slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax(this_00,args,bind,args_2,*args_3,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }